

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O0

int AllocateInternalBuffers32b(VP8LDecoder *dec,int final_width)

{
  int iVar1;
  int iVar2;
  ulong nmemb;
  uint32_t *puVar3;
  uint in_ESI;
  VP8LDecoder *in_RDI;
  uint64_t total_num_pixels;
  uint64_t cache_pixels;
  uint64_t cache_top_pixels;
  uint64_t num_pixels;
  int local_4;
  
  iVar1 = in_RDI->width_;
  iVar2 = in_RDI->height_;
  nmemb = (ulong)(in_ESI & 0xffff);
  puVar3 = (uint32_t *)WebPSafeMalloc(nmemb,(long)(int)in_ESI * 0x10);
  in_RDI->pixels_ = puVar3;
  if (in_RDI->pixels_ == (uint32_t *)0x0) {
    in_RDI->argb_cache_ = (uint32_t *)0x0;
    local_4 = VP8LSetError(in_RDI,VP8_STATUS_OUT_OF_MEMORY);
  }
  else {
    in_RDI->argb_cache_ = in_RDI->pixels_ + (long)iVar1 * (long)iVar2 + nmemb;
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int AllocateInternalBuffers32b(VP8LDecoder* const dec, int final_width) {
  const uint64_t num_pixels = (uint64_t)dec->width_ * dec->height_;
  // Scratch buffer corresponding to top-prediction row for transforming the
  // first row in the row-blocks. Not needed for paletted alpha.
  const uint64_t cache_top_pixels = (uint16_t)final_width;
  // Scratch buffer for temporary BGRA storage. Not needed for paletted alpha.
  const uint64_t cache_pixels = (uint64_t)final_width * NUM_ARGB_CACHE_ROWS;
  const uint64_t total_num_pixels =
      num_pixels + cache_top_pixels + cache_pixels;

  assert(dec->width_ <= final_width);
  dec->pixels_ = (uint32_t*)WebPSafeMalloc(total_num_pixels, sizeof(uint32_t));
  if (dec->pixels_ == NULL) {
    dec->argb_cache_ = NULL;    // for soundness
    return VP8LSetError(dec, VP8_STATUS_OUT_OF_MEMORY);
  }
  dec->argb_cache_ = dec->pixels_ + num_pixels + cache_top_pixels;
  return 1;
}